

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseStart
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  int count;
  char *pcVar1;
  char *pcVar2;
  String SVar3;
  undefined1 local_28 [8];
  String counts;
  TestCase *test_case_local;
  PrettyUnitTestResultPrinter *this_local;
  
  counts.length_ = (size_t)test_case;
  pcVar1 = TestCase::name(test_case);
  String::operator=(&this->test_case_name_,pcVar1);
  count = TestCase::test_to_run_count((TestCase *)counts.length_);
  SVar3 = FormatCountableNoun((testing *)local_28,count,"test","tests");
  ColoredPrintf(COLOR_GREEN,"[----------] ",SVar3.length_);
  pcVar1 = String::c_str((String *)local_28);
  pcVar2 = String::c_str(&this->test_case_name_);
  printf("%s from %s",pcVar1,pcVar2);
  pcVar1 = TestCase::type_param((TestCase *)counts.length_);
  if (pcVar1 == (char *)0x0) {
    printf("\n");
  }
  else {
    pcVar1 = TestCase::type_param((TestCase *)counts.length_);
    printf(", where TypeParam = %s\n",pcVar1);
  }
  fflush(_stdout);
  String::~String((String *)local_28);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseStart(const TestCase& test_case) {
  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s", counts.c_str(), test_case_name_.c_str());
  if (test_case.type_param() == NULL) {
    printf("\n");
  } else {
    printf(", where TypeParam = %s\n", test_case.type_param());
  }
  fflush(stdout);
}